

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

string * __thiscall
GEO::Environment::get_value(string *__return_storage_ptr__,Environment *this,string *name)

{
  int iVar1;
  ostream *poVar2;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = (*(this->super_Counted)._vptr_Counted[3])(this,name,__return_storage_ptr__);
  if ((char)iVar1 != '\0') {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&local_50,"Environment",(allocator *)&local_30);
  poVar2 = Logger::err(&local_50);
  poVar2 = std::operator<<(poVar2,"No such variable: ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"Environment",(allocator *)&local_30);
  poVar2 = Logger::err(&local_50);
  poVar2 = std::operator<<(poVar2,"Probably missing CmdLine::import_arg_group(\"...\");");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"variable_exists",&local_51);
  std::__cxx11::string::string
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
             ,&local_52);
  geo_assertion_failed(&local_50,&local_30,0x847);
}

Assistant:

std::string Environment::get_value(const std::string& name) const {
        std::string value;
        bool variable_exists = get_value(name, value);
        if(!variable_exists) {
            Logger::err("Environment")
                << "No such variable: " << name
                << std::endl;
            Logger::err("Environment")
                << "Probably missing CmdLine::import_arg_group(\"...\");"
                << std::endl;
        }
        geo_assert(variable_exists);
        return value;
    }